

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void State_init(void)

{
  s_x3 *__ptr;
  s_x3node *psVar1;
  long lVar2;
  
  if (x3a == (s_x3 *)0x0) {
    __ptr = (s_x3 *)malloc(0x18);
    x3a = __ptr;
    if (__ptr != (s_x3 *)0x0) {
      __ptr->size = 0x80;
      __ptr->count = 0;
      psVar1 = (s_x3node *)calloc(0x80,0x28);
      __ptr->tbl = psVar1;
      if (psVar1 == (s_x3node *)0x0) {
        free(__ptr);
        x3a = (s_x3 *)0x0;
      }
      else {
        __ptr->ht = (s_x3node **)(psVar1 + 0x80);
        lVar2 = 0;
        do {
          __ptr->ht[lVar2] = (s_x3node *)0x0;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x80);
      }
    }
    return;
  }
  return;
}

Assistant:

void State_init(void){
  if( x3a ) return;
  x3a = (struct s_x3*)malloc( sizeof(struct s_x3) );
  if( x3a ){
    x3a->size = 128;
    x3a->count = 0;
    x3a->tbl = (x3node*)calloc(128, sizeof(x3node) + sizeof(x3node*));
    if( x3a->tbl==0 ){
      free(x3a);
      x3a = 0;
    }else{
      int i;
      x3a->ht = (x3node**)&(x3a->tbl[128]);
      for(i=0; i<128; i++) x3a->ht[i] = 0;
    }
  }
}